

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall optimization::graph_color::Conflict_Map::add_node(Conflict_Map *this,VarId *var)

{
  bool bVar1;
  color cVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *in_RSI;
  key_type *in_RDI;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *in_stack_00000018;
  Conflict_Map *in_stack_00000020;
  VarId neighbor;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  VarId *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  VarId *in_stack_ffffffffffffff70;
  key_type *in_stack_ffffffffffffff78;
  Conflict_Map *in_stack_ffffffffffffff80;
  _Self local_70;
  _Self local_68;
  mapped_type *local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1b6f31);
  std::
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::operator[](&in_stack_ffffffffffffff80->static_Map,in_stack_ffffffffffffff78);
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
  operator=((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
            (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *
            )in_stack_ffffffffffffff38);
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1b6f6a);
  local_60 = std::
             map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
             ::operator[](&in_stack_ffffffffffffff80->static_Map,in_stack_ffffffffffffff78);
  local_68._M_node =
       (_Base_ptr)
       std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
       begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)in_stack_ffffffffffffff38);
  local_70._M_node =
       (_Base_ptr)
       std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
       end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
              ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x1b6fbe);
    mir::inst::VarId::VarId
              ((VarId *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    sVar3 = std::
            map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
            ::count(in_RSI,in_RDI);
    if (sVar3 != 0) {
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff38);
      add_edge(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
              ((_Rb_tree_const_iterator<mir::inst::VarId> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  std::
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::operator[](&in_stack_ffffffffffffff80->static_Map,in_stack_ffffffffffffff78);
  cVar2 = available_color(in_stack_00000020,in_stack_00000018);
  std::
  __shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)CONCAT44(cVar2,in_stack_ffffffffffffff40));
  pmVar4 = std::
           map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
           ::operator[]((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
                         *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *pmVar4 = cVar2;
  return;
}

Assistant:

void add_node(mir::inst::VarId var) {
    dynamic_Map[var] = std::set<mir::inst::VarId>();
    for (auto neighbor : static_Map[var]) {
      if (dynamic_Map.count(neighbor)) {
        add_edge(var, neighbor);
      }
    }
    (*color_map)[var] = available_color(dynamic_Map[var]);
  }